

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::SpecparamDeclaratorSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,SpecparamDeclaratorSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *node;
  size_t index_local;
  SpecparamDeclaratorSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->name).kind;
    token._2_1_ = (this->name).field_0x2;
    token.numFlags.raw = (this->name).numFlags.raw;
    token.rawLen = (this->name).rawLen;
    token.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->equals).kind;
    token_00._2_1_ = (this->equals).field_0x2;
    token_00.numFlags.raw = (this->equals).numFlags.raw;
    token_00.rawLen = (this->equals).rawLen;
    token_00.info = (this->equals).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->value)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax SpecparamDeclaratorSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return name;
        case 1: return equals;
        case 2: return value.get();
        default: return nullptr;
    }
}